

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O1

CPAccessResult ctr_el0_access(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,_Bool isread)

{
  ulong uVar1;
  uint uVar2;
  uint64_t uVar3;
  uint uVar4;
  bool bVar5;
  
  uVar1 = env->features;
  uVar2 = (uint)uVar1;
  if ((uVar2 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar4 = env->uncached_cpsr & 0x1f;
      if (uVar4 == 0x10) {
        uVar4 = 0;
      }
      else if (uVar4 == 0x16) {
        uVar4 = 3;
      }
      else if (uVar4 == 0x1a) {
        uVar4 = 2;
      }
      else {
        if ((uVar1 >> 0x21 & 1) != 0) {
          bVar5 = uVar4 == 0x16;
          if (!bVar5) {
            bVar5 = ((env->cp15).scr_el3 & 1) == 0;
          }
          if (((uVar2 >> 0x1c & 1) == 0) && (uVar4 = 3, bVar5)) goto LAB_00617a18;
        }
        uVar4 = 1;
      }
    }
    else {
      uVar4 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar4 = 1;
    if ((env->v7m).exception == 0) {
      uVar4 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_00617a18:
  if (uVar4 < 2) {
    uVar3 = arm_hcr_el2_eff_aarch64(env);
    if (uVar4 == 0) {
      if ((~uVar3 & 0x408000000) != 0) {
        if ((undefined1  [32])((undefined1  [32])(env->cp15).field_2 & (undefined1  [32])0x8000) !=
            (undefined1  [32])0x0) goto LAB_00617a29;
        uVar3 = 1;
        goto LAB_00617a85;
      }
      if ((*(byte *)((long)&(env->cp15).field_2 + 0x11) & 0x80) == 0) goto LAB_00617a80;
LAB_00617a2f:
      bVar5 = true;
    }
    else {
LAB_00617a29:
      if (((uint)uVar3 >> 0x11 & 1) == 0) goto LAB_00617a2f;
LAB_00617a80:
      uVar3 = 3;
LAB_00617a85:
      bVar5 = false;
    }
    if (!bVar5) {
      return (CPAccessResult)uVar3;
    }
  }
  if ((uVar2 >> 9 & 1) == 0) {
    if (env->aarch64 == 0) {
      uVar4 = env->uncached_cpsr & 0x1f;
      if (uVar4 == 0x10) {
        uVar2 = 0;
      }
      else if (uVar4 == 0x16) {
        uVar2 = 3;
      }
      else if (uVar4 == 0x1a) {
        uVar2 = 2;
      }
      else {
        if ((uVar1 >> 0x21 & 1) != 0) {
          bVar5 = uVar4 == 0x16;
          if (!bVar5) {
            bVar5 = ((env->cp15).scr_el3 & 1) == 0;
          }
          if (((uVar2 >> 0x1c & 1) == 0) && (uVar2 = 3, bVar5)) goto LAB_00617ac9;
        }
        uVar2 = 1;
      }
    }
    else {
      uVar2 = env->pstate >> 2 & 3;
    }
  }
  else {
    uVar2 = 1;
    if ((env->v7m).exception == 0) {
      uVar2 = ~(env->v7m).control[(env->v7m).secure] & 1;
    }
  }
LAB_00617ac9:
  if ((uVar2 < 2) && (uVar3 = arm_hcr_el2_eff_aarch64(env), ((uint)uVar3 >> 0x11 & 1) != 0)) {
    return CP_ACCESS_TRAP_EL2;
  }
  return CP_ACCESS_OK;
}

Assistant:

static CPAccessResult ctr_el0_access(CPUARMState *env, const ARMCPRegInfo *ri,
                                     bool isread)
{
    int cur_el = arm_current_el(env);

    if (cur_el < 2) {
        uint64_t hcr = arm_hcr_el2_eff(env);

        if (cur_el == 0) {
            if ((hcr & (HCR_E2H | HCR_TGE)) == (HCR_E2H | HCR_TGE)) {
                if (!(env->cp15.sctlr_el[2] & SCTLR_UCT)) {
                    return CP_ACCESS_TRAP_EL2;
                }
            } else {
                if (!(env->cp15.sctlr_el[1] & SCTLR_UCT)) {
                    return CP_ACCESS_TRAP;
                }
                if (hcr & HCR_TID2) {
                    return CP_ACCESS_TRAP_EL2;
                }
            }
        } else if (hcr & HCR_TID2) {
            return CP_ACCESS_TRAP_EL2;
        }
    }

    if (arm_current_el(env) < 2 && arm_hcr_el2_eff(env) & HCR_TID2) {
        return CP_ACCESS_TRAP_EL2;
    }

    return CP_ACCESS_OK;
}